

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O2

void __thiscall ProblemTest_CompareVars_Test::TestBody(ProblemTest_CompareVars_Test *this)

{
  bool bVar1;
  char *in_R9;
  MutVariable MVar2;
  BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  BVar3;
  AssertHelper AStack_3a8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a0;
  string local_398;
  AssertionResult gtest_ar_;
  Problem p;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem(&p);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddVar(&p,0.0,0.0,CONTINUOUS);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddVar(&p,0.0,0.0,CONTINUOUS);
  MVar2 = mp::BasicProblem<mp::BasicProblemParams<int>_>::var(&p,0);
  local_398._M_dataplus._M_p =
       MVar2.
       super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_398._M_string_length._0_4_ =
       MVar2.
       super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  BVar3.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_> =
       (BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>)
       mp::BasicProblem<mp::BasicProblemParams<int>_>::var(&p,0);
  gtest_ar_.success_ =
       mp::BasicProblem<mp::BasicProblemParams<int>>::
       BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>>>
       ::operator==((BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                     *)&local_398,BVar3);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_398,(internal *)&gtest_ar_,(AssertionResult *)"p.var(0) == p.var(0)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x7a,local_398._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_3a8,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_3a8);
    std::__cxx11::string::~string((string *)&local_398);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  MVar2 = mp::BasicProblem<mp::BasicProblemParams<int>_>::var(&p,0);
  local_398._M_dataplus._M_p =
       MVar2.
       super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_398._M_string_length._0_4_ =
       MVar2.
       super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  BVar3.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_> =
       (BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>)
       mp::BasicProblem<mp::BasicProblemParams<int>_>::var(&p,1);
  gtest_ar_.success_ =
       mp::BasicProblem<mp::BasicProblemParams<int>>::
       BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>>>
       ::operator!=((BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                     *)&local_398,BVar3);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_398,(internal *)&gtest_ar_,(AssertionResult *)"p.var(0) != p.var(1)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x7b,local_398._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_3a8,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_3a8);
    std::__cxx11::string::~string((string *)&local_398);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  MVar2 = mp::BasicProblem<mp::BasicProblemParams<int>_>::var(&p,0);
  local_398._M_dataplus._M_p =
       MVar2.
       super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_398._M_string_length._0_4_ =
       MVar2.
       super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  BVar3.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_> =
       (BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>)
       mp::BasicProblem<mp::BasicProblemParams<int>_>::var(&p,0);
  bVar1 = mp::BasicProblem<mp::BasicProblemParams<int>>::
          BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>>>
          ::operator!=((BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                        *)&local_398,BVar3);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_398,(internal *)&gtest_ar_,(AssertionResult *)"p.var(0) != p.var(0)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x7c,local_398._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_3a8,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_3a8);
    std::__cxx11::string::~string((string *)&local_398);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  MVar2 = mp::BasicProblem<mp::BasicProblemParams<int>_>::var(&p,0);
  local_398._M_dataplus._M_p =
       MVar2.
       super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_398._M_string_length._0_4_ =
       MVar2.
       super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  BVar3.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_> =
       (BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>)
       mp::BasicProblem<mp::BasicProblemParams<int>_>::var(&p,1);
  bVar1 = mp::BasicProblem<mp::BasicProblemParams<int>>::
          BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>>>
          ::operator==((BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                        *)&local_398,BVar3);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_398,(internal *)&gtest_ar_,(AssertionResult *)"p.var(0) == p.var(1)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x7d,local_398._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_3a8,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_3a8);
    std::__cxx11::string::~string((string *)&local_398);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem(&p);
  return;
}

Assistant:

TEST(ProblemTest, CompareVars) {
  Problem p;
  p.AddVar(0, 0);
  p.AddVar(0, 0);
  EXPECT_TRUE(p.var(0) == p.var(0));
  EXPECT_TRUE(p.var(0) != p.var(1));
  EXPECT_FALSE(p.var(0) != p.var(0));
  EXPECT_FALSE(p.var(0) == p.var(1));
}